

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O3

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap,void *src)

{
  flatcc_refmap_item *pfVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (refmap->count != 0) {
    pfVar1 = refmap->table;
    uVar3 = refmap->buckets - 1;
    uVar4 = ((ulong)src >> 0x21 ^ (ulong)src ^ 0x2f693b52) * -0xae502812aa7333;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = uVar4 >> 0x21 ^ uVar4;
    uVar5 = uVar4 & uVar3;
    pvVar2 = pfVar1[uVar5].src;
    while (pvVar2 != (void *)0x0) {
      if (pvVar2 == src) {
        return pfVar1[uVar5].ref;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar4 & uVar3;
      pvVar2 = pfVar1[uVar5].src;
    }
  }
  return 0;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap, const void *src)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (refmap->count == 0) {
        return flatcc_refmap_not_found;
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) return T[j].ref;
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    return flatcc_refmap_not_found;
}